

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::translate_inst(Codegen *this,OpAccInst *i)

{
  uint *__args_1;
  VarId *v;
  long in_RSI;
  long in_RDI;
  VarId *in_stack_fffffffffffffee8;
  VarId *in_stack_fffffffffffffef0;
  VarId *this_00;
  unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_> *in_stack_fffffffffffffef8;
  unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_> *__u;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *in_stack_ffffffffffffff00;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *this_01;
  VarId *in_stack_ffffffffffffff08;
  Codegen *in_stack_ffffffffffffff10;
  uint *in_stack_ffffffffffffff18;
  uint *__args_4;
  uint *in_stack_ffffffffffffff20;
  uint *__args_3;
  uint *in_stack_ffffffffffffff28;
  uint *in_stack_ffffffffffffff30;
  OpCode *in_stack_ffffffffffffff38;
  unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_> local_b0 [2];
  Reg local_9c;
  Reg local_98;
  Reg local_94;
  VarId local_90;
  Reg local_80;
  undefined4 local_7c;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> local_78 [3];
  Value *in_stack_ffffffffffffffa0;
  Codegen *in_stack_ffffffffffffffa8;
  uint local_38 [4];
  Reg local_28;
  undefined4 local_24;
  uint local_20 [8];
  
  if (*(int *)(in_RSI + 0x68) == 0) {
    __args_1 = (uint *)(in_RDI + 0x18);
    local_24 = 0xe;
    __args_4 = local_38;
    mir::inst::VarId::VarId(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_28 = translate_var_reg(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    translate_value_to_reg(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    translate_value_to_reg(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __args_3 = (uint *)&stack0xffffffffffffffa8;
    mir::inst::VarId::VarId(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    translate_var_reg(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    std::
    make_unique<arm::Arith4Inst,arm::OpCode,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              (in_stack_ffffffffffffff38,__args_1,local_20,__args_3,__args_4);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith4Inst,std::default_delete<arm::Arith4Inst>,void>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr
              (in_stack_ffffffffffffff00);
    std::unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_> *)
               in_stack_fffffffffffffef0);
  }
  else if (*(int *)(in_RSI + 0x68) == 1) {
    v = (VarId *)(in_RDI + 0x18);
    local_7c = 0xf;
    this_00 = &local_90;
    mir::inst::VarId::VarId(this_00,in_stack_fffffffffffffee8);
    local_80 = translate_var_reg(in_stack_ffffffffffffff10,v);
    local_94 = translate_value_to_reg(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    local_98 = translate_value_to_reg(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __u = local_b0;
    mir::inst::VarId::VarId(this_00,in_stack_fffffffffffffee8);
    local_9c = translate_var_reg(in_stack_ffffffffffffff10,v);
    this_01 = local_78;
    std::
    make_unique<arm::Arith4Inst,arm::OpCode,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>::
    unique_ptr<arm::Arith4Inst,std::default_delete<arm::Arith4Inst>,void>(this_01,__u);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)this_00,(value_type *)in_stack_fffffffffffffee8);
    std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::~unique_ptr(this_01);
    std::unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_>::~unique_ptr
              ((unique_ptr<arm::Arith4Inst,_std::default_delete<arm::Arith4Inst>_> *)this_00);
  }
  return;
}

Assistant:

void Codegen::translate_inst(mir::inst::OpAccInst& i) {
  switch (i.op) {
    case mir::inst::OpAcc::MulAdd:
      inst.push_back(std::make_unique<Arith4Inst>(
          arm::OpCode::Mla, translate_var_reg(i.dest),
          translate_value_to_reg(i.lhs), translate_value_to_reg(i.rhs),
          translate_var_reg(i.acc)));
      break;
    case mir::inst::OpAcc::MulShAdd:
      inst.push_back(std::make_unique<Arith4Inst>(
          arm::OpCode::SMMla, translate_var_reg(i.dest),
          translate_value_to_reg(i.lhs), translate_value_to_reg(i.rhs),
          translate_var_reg(i.acc)));
      break;
  }
}